

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int check_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[0] = a->n[0];
  local_48.n[1] = a->n[1];
  local_48.n[2] = a->n[2];
  local_48.n[3] = a->n[3];
  local_48.n[4] = a->n[4];
  local_48.magnitude = a->magnitude;
  local_48.normalized = a->normalized;
  local_78.n[0] = b->n[0];
  local_78.n[1] = b->n[1];
  local_78.n[2] = b->n[2];
  local_78.n[3] = b->n[3];
  local_78.n[4] = b->n[4];
  local_78.magnitude = b->magnitude;
  local_78.normalized = b->normalized;
  secp256k1_fe_normalize_weak(&local_48);
  secp256k1_fe_normalize_var(&local_78);
  iVar1 = secp256k1_fe_equal_var(&local_48,&local_78);
  return iVar1;
}

Assistant:

static int check_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    secp256k1_fe_normalize_var(&bn);
    return secp256k1_fe_equal_var(&an, &bn);
}